

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O3

pair<llvm::NoneType,_bool> __thiscall
llvm::SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::insert
          (SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *this,uint *V)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  long lVar5;
  pair<llvm::NoneType,_bool> pVar6;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar7;
  undefined8 uVar4;
  
  if ((this->Set)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    uVar1 = (this->Vector).super_SmallVectorImpl<unsigned_int>.
            super_SmallVectorTemplateBase<unsigned_int,_true>.
            super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
    uVar2 = (ulong)uVar1;
    if (uVar2 != 0) {
      lVar5 = 0;
      do {
        if (*(uint *)((long)(this->Vector).super_SmallVectorImpl<unsigned_int>.
                            super_SmallVectorTemplateBase<unsigned_int,_true>.
                            super_SmallVectorTemplateCommon<unsigned_int,_void>.
                            super_SmallVectorBase.BeginX + lVar5) == *V) {
          if (uVar2 << 2 != lVar5) {
            uVar3._0_4_ = None;
            uVar3._4_1_ = false;
            uVar3._5_3_ = 0;
            return (pair<llvm::NoneType,_bool>)uVar3;
          }
          break;
        }
        lVar5 = lVar5 + 4;
      } while (uVar2 << 2 != lVar5);
      if (4 < uVar1) {
        do {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&this->Set,
                     (uint *)((long)(this->Vector).super_SmallVectorImpl<unsigned_int>.
                                    super_SmallVectorTemplateBase<unsigned_int,_true>.
                                    super_SmallVectorTemplateCommon<unsigned_int,_void>.
                                    super_SmallVectorBase.BeginX + (uVar2 & 0xffffffff) * 4 + -4));
          uVar2 = (ulong)(this->Vector).super_SmallVectorImpl<unsigned_int>.
                         super_SmallVectorTemplateBase<unsigned_int,_true>.
                         super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.
                         Size - 1;
          if ((this->Vector).super_SmallVectorImpl<unsigned_int>.
              super_SmallVectorTemplateBase<unsigned_int,_true>.
              super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Capacity <
              uVar2) {
            __assert_fail("N <= capacity()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                          ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
          }
          (this->Vector).super_SmallVectorImpl<unsigned_int>.
          super_SmallVectorTemplateBase<unsigned_int,_true>.
          super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size =
               (uint)uVar2;
        } while ((uint)uVar2 != 0);
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&this->Set,V);
        uVar4._0_4_ = None;
        uVar4._4_1_ = true;
        uVar4._5_3_ = 0;
        return (pair<llvm::NoneType,_bool>)uVar4;
      }
    }
    pVar6.first = None;
    pVar6.second = true;
    pVar6._5_3_ = 0;
    SmallVectorTemplateBase<unsigned_int,_true>::push_back
              ((SmallVectorTemplateBase<unsigned_int,_true> *)this,V);
  }
  else {
    pVar7 = std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&this->Set,V);
    pVar6 = (pair<llvm::NoneType,_bool>)(((ulong)pVar7.second << 0x20) + 1);
  }
  return pVar6;
}

Assistant:

std::pair<NoneType, bool> insert(const T &V) {
    if (!isSmall())
      return std::make_pair(None, Set.insert(V).second);

    VIterator I = vfind(V);
    if (I != Vector.end())    // Don't reinsert if it already exists.
      return std::make_pair(None, false);
    if (Vector.size() < N) {
      Vector.push_back(V);
      return std::make_pair(None, true);
    }

    // Otherwise, grow from vector to set.
    while (!Vector.empty()) {
      Set.insert(Vector.back());
      Vector.pop_back();
    }
    Set.insert(V);
    return std::make_pair(None, true);
  }